

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

FILE * tplt_open(lemon *lemp)

{
  int iVar1;
  char *pcVar2;
  char *cp;
  char *toFree;
  char *tpltname;
  FILE *in;
  char buf [1000];
  lemon *lemp_local;
  
  cp = (char *)0x0;
  if (user_templatename == (char *)0x0) {
    pcVar2 = strrchr(lemp->filename,0x2e);
    if (pcVar2 == (char *)0x0) {
      lemon_sprintf((char *)&in,"%s.lt",lemp->filename);
    }
    else {
      lemon_sprintf((char *)&in,"%.*s.lt",(ulong)(uint)((int)pcVar2 - (int)lemp->filename),
                    lemp->filename);
    }
    iVar1 = access((char *)&in,4);
    if (iVar1 == 0) {
      toFree = (char *)&in;
    }
    else {
      iVar1 = access(tplt_open::templatename,4);
      if (iVar1 == 0) {
        toFree = tplt_open::templatename;
      }
      else {
        cp = pathsearch(lemp->argv0,tplt_open::templatename,0);
        toFree = cp;
      }
    }
    if (toFree == (char *)0x0) {
      fprintf(_stderr,"Can\'t find the parser driver template file \"%s\".\n",
              tplt_open::templatename);
      lemp->errorcnt = lemp->errorcnt + 1;
      lemp_local = (lemon *)0x0;
    }
    else {
      lemp_local = (lemon *)fopen(toFree,"rb");
      if (lemp_local == (lemon *)0x0) {
        fprintf(_stderr,"Can\'t open the template file \"%s\".\n",toFree);
        lemp->errorcnt = lemp->errorcnt + 1;
      }
      free(cp);
    }
  }
  else {
    iVar1 = access(user_templatename,4);
    if (iVar1 == -1) {
      fprintf(_stderr,"Can\'t find the parser driver template file \"%s\".\n",user_templatename);
      lemp->errorcnt = lemp->errorcnt + 1;
      lemp_local = (lemon *)0x0;
    }
    else {
      lemp_local = (lemon *)fopen(user_templatename,"rb");
      if (lemp_local == (lemon *)0x0) {
        fprintf(_stderr,"Can\'t open the template file \"%s\".\n",user_templatename);
        lemp->errorcnt = lemp->errorcnt + 1;
        lemp_local = (lemon *)0x0;
      }
    }
  }
  return (FILE *)lemp_local;
}

Assistant:

PRIVATE FILE *tplt_open(struct lemon *lemp)
{
  static char templatename[] = "lempar.c";
  char buf[1000];
  FILE *in;
  char *tpltname;
  char *toFree = 0;
  char *cp;

  /* first, see if user specified a template filename on the command line. */
  if (user_templatename != 0) {
    if( access(user_templatename,004)==-1 ){
      fprintf(stderr,"Can't find the parser driver template file \"%s\".\n",
        user_templatename);
      lemp->errorcnt++;
      return 0;
    }
    in = fopen(user_templatename,"rb");
    if( in==0 ){
      fprintf(stderr,"Can't open the template file \"%s\".\n",
              user_templatename);
      lemp->errorcnt++;
      return 0;
    }
    return in;
  }

  cp = strrchr(lemp->filename,'.');
  if( cp ){
    lemon_sprintf(buf,"%.*s.lt",(int)(cp-lemp->filename),lemp->filename);
  }else{
    lemon_sprintf(buf,"%s.lt",lemp->filename);
  }
  if( access(buf,004)==0 ){
    tpltname = buf;
  }else if( access(templatename,004)==0 ){
    tpltname = templatename;
  }else{
    toFree = tpltname = pathsearch(lemp->argv0,templatename,0);
  }
  if( tpltname==0 ){
    fprintf(stderr,"Can't find the parser driver template file \"%s\".\n",
    templatename);
    lemp->errorcnt++;
    return 0;
  }
  in = fopen(tpltname,"rb");
  if( in==0 ){
    fprintf(stderr,"Can't open the template file \"%s\".\n",tpltname);
    lemp->errorcnt++;
  }
  free(toFree);
  return in;
}